

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall MarrayTest::copyConstructorTest<true>(MarrayTest *this)

{
  int iVar1;
  unsigned_long *puVar2;
  pointer piVar3;
  bool bVar4;
  reference piVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  size_t sVar7;
  size_t sVar8;
  reference piVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  undefined8 uVar11;
  logic_error *plVar12;
  runtime_error *this_00;
  code *pcVar13;
  size_t sVar14;
  int iVar15;
  undefined *puVar16;
  int *piVar17;
  long lVar18;
  bool bVar19;
  Marray<int,_std::allocator<unsigned_long>_> n;
  Marray<int,_std::allocator<unsigned_long>_> m;
  int local_ec;
  unsigned_long *local_e8;
  int *local_e0;
  undefined1 local_d8 [16];
  size_t *local_c8;
  size_t *local_c0;
  size_t *local_b8;
  size_t local_b0;
  size_t local_a8;
  CoordinateOrder local_a0;
  bool local_9c;
  Marray<int,_std::allocator<unsigned_long>_> local_90;
  unsigned_long *local_48;
  MarrayTest *local_40;
  int *local_38;
  
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ = (pointer)0x0;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_ = (size_t *)0x0;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shapeStrides_ =
       (size_t *)0x0;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.strides_ = (size_t *)0x0
  ;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ = 0;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ = 0;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.coordinateOrder_ =
       LastMajorOrder;
  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ = true;
  local_40 = this;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ == false)
  {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
  operator_delete((void *)local_d8._0_8_,local_a8 << 2);
  operator_delete(local_c8,local_b0 * 0x18);
  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ <<
                  2);
  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_,
                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ * 0x18);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_90,&local_40->scalar_,&andres::defaultOrder,(allocator_type *)local_d8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
  if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  else {
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ !=
          local_b0) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"test failed.");
        pcVar13 = std::logic_error::~logic_error;
        puVar16 = &std::logic_error::typeinfo;
        goto LAB_001dcd57;
      }
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
          local_a8) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"test failed.");
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_ec = 0;
      piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,&local_ec
                         );
      iVar15 = *piVar5;
      local_ec = 0;
      piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,&local_ec);
      if (iVar15 != *piVar5) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"test failed.");
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      operator_delete((void *)local_d8._0_8_,local_a8 << 2);
      operator_delete(local_c8,local_b0 * 0x18);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      _Var6._M_current = (unsigned_long *)operator_new(8);
      *_Var6._M_current = 0x18;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var6,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var6._M_current + 1),&local_40->scalar_,&andres::defaultOrder,
                 (allocator_type *)local_d8);
      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
          local_a8) {
LAB_001dcb68:
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"test failed.");
        pcVar13 = std::logic_error::~logic_error;
        puVar16 = &std::logic_error::typeinfo;
        goto LAB_001dce0b;
      }
      if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
      }
      else {
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_
              != local_b0) goto LAB_001dcb68;
          iVar15 = 0;
          do {
            local_ec = iVar15;
            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                &local_ec);
            iVar1 = *piVar5;
            local_ec = iVar15;
            piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,
                                &local_ec);
            if (iVar1 != *piVar5) {
              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar12,"test failed.");
              __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 != 0x18);
          operator_delete((void *)local_d8._0_8_,local_a8 << 2);
          operator_delete(local_c8,local_b0 * 0x18);
          operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          operator_delete(_Var6._M_current,8);
          _Var6._M_current = (unsigned_long *)operator_new(0x10);
          *_Var6._M_current = 6;
          _Var6._M_current[1] = 4;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var6,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var6._M_current + 2),&local_40->scalar_,&andres::defaultOrder,
                     (allocator_type *)local_d8);
          andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
          if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
              local_a8) {
LAB_001dcb97:
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar12,"test failed.");
            pcVar13 = std::logic_error::~logic_error;
            puVar16 = &std::logic_error::typeinfo;
            goto LAB_001dce5b;
          }
          if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0)
          {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          else {
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ != local_b0) goto LAB_001dcb97;
              sVar14 = 0;
              do {
                iVar15 = 0;
                do {
                  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)&local_90,
                                      sVar14,iVar15);
                  iVar1 = *piVar5;
                  piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)local_d8,
                                      sVar14,iVar15);
                  if (iVar1 != *piVar5) {
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar12,"test failed.");
                    __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 4);
                sVar14 = sVar14 + 1;
              } while (sVar14 != 6);
              operator_delete((void *)local_d8._0_8_,local_a8 << 2);
              operator_delete(local_c8,local_b0 * 0x18);
              operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var6._M_current,0x10);
              local_e8 = (unsigned_long *)operator_new(0x18);
              *local_e8 = 3;
              local_e8[1] = 4;
              local_e8[2] = 2;
              andres::Marray<int,std::allocator<unsigned_long>>::
              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_e8,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_e8 + 3),&local_40->scalar_,&andres::defaultOrder,
                         (allocator_type *)local_d8);
              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_d8,&local_90);
              if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
                  local_a8) {
LAB_001dcbc6:
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar12,"test failed.");
                pcVar13 = std::logic_error::~logic_error;
                puVar16 = &std::logic_error::typeinfo;
                goto LAB_001dceab;
              }
              if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                  (pointer)0x0) {
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
              }
              else {
                if ((pointer)local_d8._0_8_ != (pointer)0x0) {
                  if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ != local_b0) goto LAB_001dcbc6;
                  local_e0 = (int *)0x0;
                  do {
                    sVar14 = 0;
                    do {
                      iVar15 = 0;
                      bVar4 = true;
                      do {
                        bVar19 = bVar4;
                        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                  (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>)
                        ;
                        piVar3 = local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_;
                        if ((local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                             == (pointer)0x0) ||
                           (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                            geometry_.dimension_ != 3)) {
                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar12,"Assertion failed.");
LAB_001dc756:
                          pcVar13 = std::runtime_error::~runtime_error;
                          puVar16 = &std::runtime_error::typeinfo;
LAB_001dc764:
                          __cxa_throw(plVar12,puVar16,pcVar13);
                        }
                        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          (&local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,0
                                          );
                        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                elementAccessHelper<int>
                                          (&local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,3
                                           ,sVar14,iVar15);
                        iVar1 = piVar3[sVar7 * (long)local_e0 + sVar8];
                        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
                        uVar11 = local_d8._0_8_;
                        if (((pointer)local_d8._0_8_ == (pointer)0x0) || (local_b0 != 3)) {
                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar12,"Assertion failed.");
                          goto LAB_001dc756;
                        }
                        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_d8,0);
                        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                elementAccessHelper<int>
                                          ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_d8,3,sVar14,iVar15);
                        if (iVar1 != *(int *)(uVar11 + (sVar7 * (long)local_e0 + sVar8) * 4)) {
                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar12,"test failed.");
                          pcVar13 = std::logic_error::~logic_error;
                          puVar16 = &std::logic_error::typeinfo;
                          goto LAB_001dc764;
                        }
                        iVar15 = 1;
                        bVar4 = false;
                      } while (bVar19);
                      sVar14 = sVar14 + 1;
                    } while (sVar14 != 4);
                    local_e0 = (int *)((long)local_e0 + 1);
                  } while (local_e0 != (int *)0x3);
                  operator_delete((void *)local_d8._0_8_,local_a8 << 2);
                  operator_delete(local_c8,local_b0 * 0x18);
                  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_,local_90.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_ << 2);
                  operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_,
                                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ * 0x18);
                  operator_delete(local_e8,0x18);
                  local_d8._0_8_ = local_40;
                  local_c8 = (size_t *)operator_new(0);
                  local_b0 = 0;
                  local_a8 = 1;
                  local_a0 = LastMajorOrder;
                  local_9c = true;
                  local_c0 = local_c8;
                  local_b8 = local_c8;
                  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                  andres::Marray<int,std::allocator<unsigned_long>>::
                  Marray<int,true,std::allocator<unsigned_long>>
                            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                             (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                  if (local_a8 !=
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_) goto LAB_001dca7d;
                  if ((MarrayTest *)local_d8._0_8_ == (MarrayTest *)0x0) {
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  else {
                    if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ !=
                        (pointer)0x0) {
                      if (local_b0 ==
                          local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          dimension_) {
                        local_ec = 0;
                        piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,true,std::allocator<unsigned_long>>
                                           ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                            local_d8,&local_ec);
                        iVar15 = *piVar9;
                        local_ec = 0;
                        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,false,std::allocator<unsigned_long>>
                                           (&local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            &local_ec);
                        if (iVar15 == *piVar5) {
                          operator_delete(local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          data_,local_90.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .geometry_.size_ << 2);
                          operator_delete(local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shape_,
                                          local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ * 0x18);
                          operator_delete(local_c8,local_b0 * 0x18);
                          _Var6._M_current = (unsigned_long *)operator_new(8);
                          *_Var6._M_current = 0x18;
                          local_e0 = local_40->data_;
                          local_d8._0_8_ = local_e0;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),_Var6
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var6._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_90);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                          andres::Marray<int,std::allocator<unsigned_long>>::
                          Marray<int,true,std::allocator<unsigned_long>>
                                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8);
                          if (local_a8 !=
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_) {
LAB_001dcbf5:
                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar12,"test failed.");
                            pcVar13 = std::logic_error::~logic_error;
                            puVar16 = &std::logic_error::typeinfo;
                            goto LAB_001dcf7a;
                          }
                          if ((int *)local_d8._0_8_ == (int *)0x0) {
                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar12,"Assertion failed.");
                          }
                          else {
                            if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                data_ != (pointer)0x0) {
                              if (local_b0 !=
                                  local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_) goto LAB_001dcbf5;
                              iVar15 = 0;
                              do {
                                local_ec = iVar15;
                                piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,true,std::allocator<unsigned_long>>
                                                   ((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_d8,&local_ec);
                                iVar1 = *piVar9;
                                local_ec = iVar15;
                                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                if (iVar1 != *piVar5) {
                                  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar12,"test failed.");
                                  __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                iVar15 = iVar15 + 1;
                              } while (iVar15 != 0x18);
                              operator_delete(local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_c8,local_b0 * 0x18);
                              operator_delete(_Var6._M_current,8);
                              _Var6._M_current = (unsigned_long *)operator_new(8);
                              *_Var6._M_current = 6;
                              _Var10._M_current = (unsigned_long *)operator_new(8);
                              *_Var10._M_current = 4;
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                   = (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                              local_d8._0_8_ = local_e0;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_d8 + 8),
                                         _Var6,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var6._M_current + 1),_Var10,
                                         (CoordinateOrder *)&local_90,(allocator_type *)&local_ec);
                              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_d8
                                        );
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              Marray<int,true,std::allocator<unsigned_long>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_d8
                                        );
                              iVar15 = 0;
                              piVar17 = local_e0;
                              do {
                                local_ec = iVar15;
                                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                if (*piVar5 != *piVar17) {
                                  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar12,"test failed.");
                                  __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                iVar15 = iVar15 + 1;
                                piVar17 = piVar17 + 4;
                              } while (iVar15 != 6);
                              if ((int *)local_d8._0_8_ == (int *)0x0) {
                                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar12,"Assertion failed.");
                              }
                              else {
                                if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    data_ != (pointer)0x0) {
                                  if (local_b0 ==
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_) {
                                    local_ec = 0;
                                    piVar9 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,true,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_ec);
                                    iVar15 = *piVar9;
                                    local_ec = 0;
                                    piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                    if ((iVar15 == *piVar5) &&
                                       (local_a8 ==
                                        local_90.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_)) {
                                      operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a8 << 2);
                                      operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                      operator_delete(local_c8,local_b0 * 0x18);
                                      operator_delete(_Var10._M_current,8);
                                      operator_delete(_Var6._M_current,8);
                                      _Var6._M_current = (unsigned_long *)operator_new(8);
                                      *_Var6._M_current = 6;
                                      _Var10._M_current = (unsigned_long *)operator_new(8);
                                      *_Var10._M_current = 4;
                                      piVar17 = local_40->data_ + 2;
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                                           (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                                      local_d8._0_8_ = piVar17;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_d8 + 8),_Var6,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),_Var10,
                                                 (CoordinateOrder *)&local_90,
                                                 (allocator_type *)&local_ec);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_d8);
                                      andres::Marray<int,std::allocator<unsigned_long>>::
                                      Marray<int,true,std::allocator<unsigned_long>>
                                                ((Marray<int,std::allocator<unsigned_long>> *)
                                                 &local_90,
                                                 (View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 local_d8);
                                      iVar15 = 0;
                                      do {
                                        local_ec = iVar15;
                                        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                                 execute<int,int,false,std::allocator<unsigned_long>>
                                                           (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                        if (*piVar5 != *piVar17) {
                                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar12,"test failed.");
                                          __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                      std::logic_error::~logic_error);
                                        }
                                        iVar15 = iVar15 + 1;
                                        piVar17 = piVar17 + 4;
                                      } while (iVar15 != 6);
                                      if ((int *)local_d8._0_8_ == (int *)0x0) {
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar12,"Assertion failed.");
                                      }
                                      else {
                                        if (local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ != (pointer)0x0) {
                                          if (local_b0 ==
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_) {
                                            local_ec = 0;
                                            piVar9 = andres::marray_detail::
                                                     AccessOperatorHelper<true>::
                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_ec);
                                            iVar15 = *piVar9;
                                            local_ec = 0;
                                            piVar5 = andres::marray_detail::
                                                     AccessOperatorHelper<true>::
                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                            if ((iVar15 == *piVar5) &&
                                               (local_a8 ==
                                                local_90.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .geometry_.size_)) {
                                              operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a8 << 2);
                                              operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                              operator_delete(local_c8,local_b0 * 0x18);
                                              operator_delete(_Var10._M_current,8);
                                              operator_delete(_Var6._M_current,8);
                                              _Var6._M_current = (unsigned_long *)operator_new(0x10)
                                              ;
                                              *_Var6._M_current = 6;
                                              _Var6._M_current[1] = 4;
                                              local_d8._0_8_ = local_e0;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_d8 + 8),_Var6,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_90)
                                              ;
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              Marray<int,true,std::allocator<unsigned_long>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_90,
                                                         (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                              if (local_a8 !=
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001dcc24:
                                                plVar12 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error
                                                          (plVar12,"test failed.");
                                                pcVar13 = std::logic_error::~logic_error;
                                                puVar16 = &std::logic_error::typeinfo;
                                                goto LAB_001dd06a;
                                              }
                                              if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                plVar12 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar12,
                                                           "Assertion failed.");
                                              }
                                              else {
                                                if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                  if (local_b0 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001dcc24;
                                                  sVar14 = 0;
                                                  do {
                                                    iVar15 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar14,iVar15);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar14,iVar15);
                                                  if (iVar1 != *piVar5) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar15 = iVar15 + 1;
                                                  } while (iVar15 != 4);
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 6);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(_Var6._M_current,0x10);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 2;
                                                  local_e8 = (unsigned_long *)operator_new(0x10);
                                                  *local_e8 = 1;
                                                  local_e8[1] = 3;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                                                  local_d8._0_8_ = local_e0;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_e8,(CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_ec);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  local_48 = _Var6._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  iVar15 = 0;
                                                  bVar4 = true;
                                                  do {
                                                    bVar19 = bVar4;
                                                    sVar14 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar14,iVar15);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar14,iVar15);
                                                  puVar2 = local_48;
                                                  if (iVar1 != *piVar5) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 3);
                                                  iVar15 = 1;
                                                  bVar4 = false;
                                                  } while (bVar19);
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_ec = 0;
                                                    piVar9 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_ec);
                                                  iVar15 = *piVar9;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if ((iVar15 == *piVar5) &&
                                                     (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_)) {
                                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a8 << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_e8,0x10);
                                                  operator_delete(puVar2,0x10);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 2;
                                                  local_48 = (unsigned_long *)operator_new(0x10);
                                                  *local_48 = 1;
                                                  local_48[1] = 3;
                                                  local_d8._0_8_ = local_40->data100_ + 0x32;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 2),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_48,(CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_ec);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  local_e8 = _Var6._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  local_38 = local_40->data100_;
                                                  iVar15 = 0;
                                                  bVar4 = true;
                                                  do {
                                                    bVar19 = bVar4;
                                                    sVar14 = 0;
                                                    do {
                                                      piVar9 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_d8,sVar14,iVar15);
                                                  iVar1 = *piVar9;
                                                  piVar5 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,sVar14,iVar15);
                                                  puVar2 = local_e8;
                                                  if (iVar1 != *piVar5) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 3);
                                                  iVar15 = 1;
                                                  bVar4 = false;
                                                  } while (bVar19);
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_ec = 0;
                                                    piVar9 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,&local_ec);
                                                  iVar15 = *piVar9;
                                                  local_ec = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_ec);
                                                  if ((iVar15 == *piVar5) &&
                                                     (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_)) {
                                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_a8 << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_48,0x10);
                                                  operator_delete(puVar2,0x10);
                                                  local_e8 = (unsigned_long *)operator_new(0x18);
                                                  *local_e8 = 3;
                                                  local_e8[1] = 4;
                                                  local_e8[2] = 2;
                                                  local_d8._0_8_ = local_e0;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_e8 + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_90)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001dcc53:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001dd167;
                                                  }
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (local_b0 !=
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001dcc53;
                                                  local_e0 = (int *)0x0;
                                                  do {
                                                    sVar14 = 0;
                                                    do {
                                                      iVar15 = 0;
                                                      bVar4 = true;
                                                      do {
                                                        bVar19 = bVar4;
                                                        andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar11 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001dc7d2:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001dc7e0:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar14,iVar15);
                                                  iVar1 = *(int *)(uVar11 + (sVar7 * (long)local_e0
                                                                            + sVar8) * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar3 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001dc7d2;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar14,iVar15);
                                                  if (iVar1 != piVar3[sVar7 * (long)local_e0 + sVar8
                                                                     ]) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001dc7e0;
                                                  }
                                                  iVar15 = 1;
                                                  bVar4 = false;
                                                  } while (bVar19);
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 4);
                                                  local_e0 = (int *)((long)local_e0 + 1);
                                                  } while (local_e0 != (int *)0x3);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_e8,0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_e8 = _Var6._M_current;
                                                  local_48 = (unsigned_long *)operator_new(0x18);
                                                  *local_48 = 2;
                                                  local_48[1] = 10;
                                                  local_48[2] = 0x23;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                                                  local_d8._0_8_ = local_38;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_48,(CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_ec);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 !=
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001dcc82:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001dd1b7;
                                                  }
                                                  if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (local_b0 !=
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001dcc82;
                                                  iVar15 = 0;
                                                  uVar11 = CONCAT71((int7)(local_b0 >> 8),1);
                                                  do {
                                                    local_e0 = (int *)CONCAT44(local_e0._4_4_,
                                                                               (int)uVar11);
                                                    sVar14 = 0;
                                                    do {
                                                      lVar18 = 0;
                                                      do {
                                                        andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar11 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001dc84e:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001dc85c:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar14,iVar15);
                                                  iVar1 = *(int *)(uVar11 + (sVar7 * lVar18 + sVar8)
                                                                            * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar3 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001dc84e;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar14,iVar15);
                                                  if (iVar1 != piVar3[sVar7 * lVar18 + sVar8]) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001dc85c;
                                                  }
                                                  lVar18 = lVar18 + 1;
                                                  } while (lVar18 != 3);
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 4);
                                                  iVar15 = 1;
                                                  uVar11 = 0;
                                                  } while (((ulong)local_e0 & 1) != 0);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_48,0x18);
                                                  operator_delete(local_e8,0x18);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var6._M_current = 3;
                                                  _Var6._M_current[1] = 4;
                                                  _Var6._M_current[2] = 2;
                                                  local_e8 = _Var6._M_current;
                                                  _Var10._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var10._M_current = 2;
                                                  _Var10._M_current[1] = 10;
                                                  _Var10._M_current[2] = 0x23;
                                                  local_d8._0_8_ = local_40->data100_ + 0x1e;
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)CONCAT44(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_._4_4_,1);
                                                  local_40 = (MarrayTest *)_Var10._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_d8 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),_Var10,
                                                  (CoordinateOrder *)&local_90,
                                                  (allocator_type *)&local_ec);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::Marray<int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_d8);
                                                  if (local_a8 ==
                                                      local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
                                                    if ((int *)local_d8._0_8_ == (int *)0x0) {
                                                      plVar12 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar12,
                                                                 "Assertion failed.");
                                                    }
                                                    else {
                                                      if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (local_b0 ==
                                                        local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    iVar15 = 0;
                                                    uVar11 = CONCAT71((int7)(local_b0 >> 8),1);
                                                    do {
                                                      local_e0 = (int *)CONCAT44(local_e0._4_4_,
                                                                                 (int)uVar11);
                                                      sVar14 = 0;
                                                      do {
                                                        lVar18 = 0;
                                                        do {
                                                          andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8);
                                                  uVar11 = local_d8._0_8_;
                                                  if (((int *)local_d8._0_8_ == (int *)0x0) ||
                                                     (local_b0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001dc8ca:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
LAB_001dc8d8:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_d8,3,sVar14,iVar15);
                                                  iVar1 = *(int *)(uVar11 + (sVar7 * lVar18 + sVar8)
                                                                            * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar3 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001dc8ca;
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar14,iVar15);
                                                  if (iVar1 != piVar3[sVar7 * lVar18 + sVar8]) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                    goto LAB_001dc8d8;
                                                  }
                                                  lVar18 = lVar18 + 1;
                                                  } while (lVar18 != 3);
                                                  sVar14 = sVar14 + 1;
                                                  } while (sVar14 != 4);
                                                  iVar15 = 1;
                                                  uVar11 = 0;
                                                  if (((ulong)local_e0 & 1) == 0) {
                                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_c8,local_b0 * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_e8,0x18);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  goto LAB_001dceb3;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
LAB_001dceb3:
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_001dd1b7:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_001dd167:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_001dd112;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_001dd112:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_001dd0ba;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_001dd0ba:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                }
                                                plVar12 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar12,
                                                           "Assertion failed.");
                                              }
                                              pcVar13 = std::runtime_error::~runtime_error;
                                              puVar16 = &std::runtime_error::typeinfo;
LAB_001dd06a:
                                              __cxa_throw(plVar12,puVar16,pcVar13);
                                            }
                                          }
                                          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar12,"test failed.");
                                          pcVar13 = std::logic_error::~logic_error;
                                          puVar16 = &std::logic_error::typeinfo;
                                          goto LAB_001dd01a;
                                        }
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar12,"Assertion failed.");
                                      }
                                      pcVar13 = std::runtime_error::~runtime_error;
                                      puVar16 = &std::runtime_error::typeinfo;
LAB_001dd01a:
                                      __cxa_throw(plVar12,puVar16,pcVar13);
                                    }
                                  }
                                  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar12,"test failed.");
                                  pcVar13 = std::logic_error::~logic_error;
                                  puVar16 = &std::logic_error::typeinfo;
                                  goto LAB_001dcfca;
                                }
                                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar12,"Assertion failed.");
                              }
                              pcVar13 = std::runtime_error::~runtime_error;
                              puVar16 = &std::runtime_error::typeinfo;
LAB_001dcfca:
                              __cxa_throw(plVar12,puVar16,pcVar13);
                            }
                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar12,"Assertion failed.");
                          }
                          pcVar13 = std::runtime_error::~runtime_error;
                          puVar16 = &std::runtime_error::typeinfo;
LAB_001dcf7a:
                          __cxa_throw(plVar12,puVar16,pcVar13);
                        }
                      }
LAB_001dca7d:
                      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar12,"test failed.");
                      pcVar13 = std::logic_error::~logic_error;
                      puVar16 = &std::logic_error::typeinfo;
                      goto LAB_001dcf2a;
                    }
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  pcVar13 = std::runtime_error::~runtime_error;
                  puVar16 = &std::runtime_error::typeinfo;
LAB_001dcf2a:
                  __cxa_throw(plVar12,puVar16,pcVar13);
                }
                plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
              }
              pcVar13 = std::runtime_error::~runtime_error;
              puVar16 = &std::runtime_error::typeinfo;
LAB_001dceab:
              __cxa_throw(plVar12,puVar16,pcVar13);
            }
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          pcVar13 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
LAB_001dce5b:
          __cxa_throw(plVar12,puVar16,pcVar13);
        }
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
      }
      pcVar13 = std::runtime_error::~runtime_error;
      puVar16 = &std::runtime_error::typeinfo;
LAB_001dce0b:
      __cxa_throw(plVar12,puVar16,pcVar13);
    }
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  pcVar13 = std::runtime_error::~runtime_error;
  puVar16 = &std::runtime_error::typeinfo;
LAB_001dcd57:
  __cxa_throw(plVar12,puVar16,pcVar13);
}

Assistant:

void MarrayTest::copyConstructorTest() {
    // contruction from a Marray
    {
        // empty 
        {
            andres::Marray<int> m;
            andres::Marray<int> n(m);
        }
        // scalar
        {
            andres::Marray<int> m(scalar_);
            andres::Marray<int> n(m);

            test(m.dimension() == n.dimension());
            test(m.size() == n.size());
            test(m(0) == n(0));
        }
        // 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 24; ++x)
                test(m(x)==n(x));
        }
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 6; ++x){
                for(int y = 0; y < 4; ++y)
                    test(m(x, y)==n(x, y));
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 3; ++x){
                for(int y = 0; y < 4; ++y){
                    for(int z = 0; z < 2; ++z)
                        test(m(x, y, z)==n(x, y, z));
                }
            }
        }
    }
    // contruction from a view
    {
        // scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            andres::Marray<int> m(v);
            test(v.size()==m.size() &&
                   v.dimension()==m.dimension() &&
                   v(0)==m(0));
        }
        // View is 1D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 0; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_+2, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 2; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 2D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+50, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 3D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x)
                for(int y = 0; y < 4; ++y)
                for(int z = 0; z < 2; ++z){
                    test(v(x, y, z)==m(x, y, z));
                    
                }
            }
            // with strides and without offset
            {        
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
            // with strides and offset
            {       
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+30, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
        }
    }
}